

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

void __thiscall ColorPrimariesACES::ColorPrimariesACES(ColorPrimariesACES *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  allocator_type local_f2;
  allocator_type local_f1;
  _Vector_base<float,_std::allocator<float>_> local_f0;
  ColorPrimaryTransform local_d4;
  _Vector_base<float,_std::allocator<float>_> local_b0;
  float local_98 [12];
  float local_68 [11];
  ColorPrimaryTransform local_3c;
  
  local_68[4] = 0.7281661;
  local_68[5] = -0.07213254;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[0] = 0.9525524;
  local_68[1] = 0.0;
  local_68[2] = 9.36786e-05;
  local_68[3] = 0.34396645;
  local_68[8] = 1.0088252;
  __l._M_len = 9;
  __l._M_array = local_68;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_f0,__l,&local_f1);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&local_d4,(vector<float,_std::allocator<float>_> *)&local_f0);
  local_98[4] = 1.3733131;
  local_98[5] = 0.09824003;
  local_98[6] = 0.0;
  local_98[7] = 0.0;
  local_98[0] = 1.049811;
  local_98[1] = 0.0;
  local_98[2] = -9.74845e-05;
  local_98[3] = -0.49590302;
  local_98[8] = 0.991252;
  __l_00._M_len = 9;
  __l_00._M_array = local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_b0,__l_00,&local_f2);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&local_3c,(vector<float,_std::allocator<float>_> *)&local_b0);
  (this->super_ColorPrimaries).toXYZ.matrix[2][2] = local_d4.matrix[2][2];
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[1] + 1) = local_d4.matrix[1]._4_8_;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[2] = local_d4.matrix[2]._0_8_;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[0] = local_d4.matrix[0]._0_8_;
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[0] + 2) = local_d4.matrix._8_8_;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[0] = local_3c.matrix[0]._0_8_;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[0] + 2) = local_3c.matrix._8_8_;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[1] + 1) = local_3c.matrix[1]._4_8_;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[2] = local_3c.matrix[2]._0_8_;
  (this->super_ColorPrimaries).fromXYZ.matrix[2][2] = local_3c.matrix[2][2];
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_b0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_f0);
  return;
}

Assistant:

ColorPrimariesACES() : ColorPrimaries(
        ColorPrimaryTransform({
            +0.9525523959f,  0.0000000000f, +0.0000936786f,
            +0.3439664498f, +0.7281660966f, -0.0721325464f,
             0.0000000000f,  0.0000000000f, +1.0088251844f
        }),
        ColorPrimaryTransform({
            +1.0498110175f,  0.0000000000f, -0.0000974845f,
            -0.4959030231f, +1.3733130458f, +0.0982400361f,
             0.0000000000f,  0.0000000000f, +0.9912520182f
        })
    ) {}